

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitreader_buffer.c
# Opt level: O0

uint32_t aom_rb_read_uvlc(aom_read_bit_buffer *rb)

{
  int iVar1;
  uint32_t value;
  uint32_t base;
  int leading_zeros;
  int in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  undefined4 local_4;
  
  iVar2 = 0;
  while( true ) {
    in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 & 0xffffff;
    if (iVar2 < 0x20) {
      iVar1 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(iVar2,in_stack_ffffffffffffffe8));
      in_stack_ffffffffffffffe0 = CONCAT13(iVar1 != 0,(int3)in_stack_ffffffffffffffe0) ^ 0xff000000;
    }
    if ((in_stack_ffffffffffffffe0 & 0x1000000) == 0) break;
    iVar2 = iVar2 + 1;
  }
  if (iVar2 == 0x20) {
    local_4 = 0xffffffff;
  }
  else {
    iVar2 = (1 << ((byte)iVar2 & 0x1f)) + -1;
    iVar1 = aom_rb_read_literal((aom_read_bit_buffer *)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffdc);
    local_4 = iVar2 + iVar1;
  }
  return local_4;
}

Assistant:

uint32_t aom_rb_read_uvlc(struct aom_read_bit_buffer *rb) {
  int leading_zeros = 0;
  while (leading_zeros < 32 && !aom_rb_read_bit(rb)) ++leading_zeros;
  // Maximum 32 bits.
  if (leading_zeros == 32) return UINT32_MAX;
  const uint32_t base = (1u << leading_zeros) - 1;
  const uint32_t value = aom_rb_read_literal(rb, leading_zeros);
  return base + value;
}